

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::PythonParameter::ByteSizeLong(PythonParameter *this)

{
  bool bVar1;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  string *psVar3;
  size_t sVar4;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  PythonParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = PythonParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0xf) != 0) {
    bVar1 = has_module(this);
    if (bVar1) {
      psVar3 = module_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_layer(this);
    if (bVar1) {
      psVar3 = layer_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_param_str(this);
    if (bVar1) {
      psVar3 = param_str_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_share_in_parallel(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t PythonParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.PythonParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 15u) {
    // optional string module = 1;
    if (has_module()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->module());
    }

    // optional string layer = 2;
    if (has_layer()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->layer());
    }

    // optional string param_str = 3 [default = ""];
    if (has_param_str()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->param_str());
    }

    // optional bool share_in_parallel = 4 [default = false];
    if (has_share_in_parallel()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}